

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompileType<signed_char>(void)

{
  undefined1 uVar1;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar2;
  char result;
  char x;
  bool b2;
  char *p4;
  char *p3;
  char *r;
  char *p2;
  char *p1;
  longdouble ld;
  double d;
  float f;
  size_t size;
  wchar_t w;
  bool b;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> sb;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> st;
  char t;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> i;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> s;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
  *in_stack_ffffffffffffff88;
  SafeInt *this;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffff9d;
  undefined1 in_stack_ffffffffffffff9e;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_b;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_a;
  char local_9 [8];
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_1;
  
  this = (SafeInt *)&local_1;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this);
  local_9[1] = '\0';
  local_9[2] = '\0';
  local_9[3] = '\0';
  local_9[4] = '\0';
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<Foo>
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this,
             (Foo *)in_stack_ffffffffffffff88);
  local_9[0] = '\0';
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            (&local_a,local_9);
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            (&local_b,false);
  CompiledMixedType<signed_char,char>();
  CompiledMixedType<signed_char,signed_char>();
  CompiledMixedType<signed_char,unsigned_char>();
  CompiledMixedType<signed_char,short>();
  CompiledMixedType<signed_char,unsigned_short>();
  CompiledMixedType<signed_char,int>();
  CompiledMixedType<signed_char,unsigned_int>();
  CompiledMixedType<signed_char,long>();
  CompiledMixedType<signed_char,unsigned_long>();
  CompiledMixedType<signed_char,long_long>();
  CompiledMixedType<signed_char,unsigned_long_long>();
  ModulusFriendTest<signed_char,char>();
  ModulusFriendTest<signed_char,signed_char>();
  ModulusFriendTest<signed_char,unsigned_char>();
  ModulusFriendTest<signed_char,short>();
  ModulusFriendTest<signed_char,unsigned_short>();
  ModulusFriendTest<signed_char,int>();
  ModulusFriendTest<signed_char,unsigned_int>();
  ModulusFriendTest<signed_char,long>();
  ModulusFriendTest<signed_char,unsigned_long>();
  ModulusFriendTest<signed_char,long_long>();
  ModulusFriendTest<signed_char,unsigned_long_long>();
  SafeInt::operator_cast_to_bool(this);
  SafeInt::operator_cast_to_wchar_t
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this);
  SafeInt::operator_cast_to_unsigned_long
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this);
  SafeInt::operator_cast_to_float
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this);
  SafeInt::operator_cast_to_double
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this);
  SafeInt::operator_cast_to_long_double
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this);
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::Ptr(&local_1);
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::Ptr(&local_1);
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::Ref(&local_1);
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&(&local_1);
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&(&local_1);
  uVar1 = SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator!
                    (&local_a);
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+(&local_a);
  local_9[0] = SafeInt::operator_cast_to_signed_char
                         ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                           *)this);
  SVar2 = SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator++
                    ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                     CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff9e,
                                             CONCAT15(in_stack_ffffffffffffff9d,
                                                      CONCAT14(in_stack_ffffffffffffff9c,
                                                               in_stack_ffffffffffffff98)))),
                     (int)((ulong)this >> 0x20));
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator++
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this);
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator--
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(uVar1,CONCAT16(SVar2.m_int,
                                     CONCAT15(in_stack_ffffffffffffff9d,
                                              CONCAT14(in_stack_ffffffffffffff9c,
                                                       in_stack_ffffffffffffff98)))),
             (int)((ulong)this >> 0x20));
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator--
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this);
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator~
            (in_stack_ffffffffffffff88);
  local_9[0] = SafeInt::operator_cast_to_signed_char
                         ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                           *)this);
  SafeNegation<signed_char>((char)((ulong)this >> 0x38),&in_stack_ffffffffffffff88->m_int);
  return;
}

Assistant:

void CompileType()
{
	// Test constructors
	SafeInt<T> s;
	SafeInt<T> i(Foo::Foo1);
	T t = 0;
	SafeInt<T> st(t);
	SafeInt<T> sb(false);

	// Mixed operations
	CompiledMixedType<T, char>();
	CompiledMixedType<T, signed char>();
	CompiledMixedType<T, unsigned char>();
	CompiledMixedType<T, short>();
	CompiledMixedType<T, unsigned short>();
	CompiledMixedType<T, int>();
	CompiledMixedType<T, unsigned int>();
	CompiledMixedType<T, long>();
	CompiledMixedType<T, unsigned long>();
	CompiledMixedType<T, long long>();
	CompiledMixedType<T, unsigned long long>();

	// This is making trouble for the compiler
	ModulusFriendTest<T, char>();
	ModulusFriendTest<T, signed char>();
	ModulusFriendTest<T, unsigned char>();
	ModulusFriendTest<T, short>();
	ModulusFriendTest<T, unsigned short>();
	ModulusFriendTest<T, int>();
	ModulusFriendTest<T, unsigned int>();
	ModulusFriendTest<T, long>();
	ModulusFriendTest<T, unsigned long>();
	ModulusFriendTest<T, long long>();
	ModulusFriendTest<T, unsigned long long>();
	
	// Special case casts
	bool b = (bool)s;
	wchar_t w = (wchar_t)s;
	size_t size = (size_t)s;
	float f = (float)s;
	double d = (double)s;
	long double ld = (long double)s;

	// Pointer operations
	T* p1 = s.Ptr();
	const T* p2 = s.Ptr();
	const T& r = s.Ref();
	T* p3 = &s;
	const T* p4 = &s;

	// Unary operators
	bool b2 = !st;
	t = +st;

	st++;
	++st;
	st--;
	--st;
	t = ~st;

	// Get compile time coverage of negation
	T x = 1;
	T result;

	(void)SafeNegation(x, result);

}